

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

String * __thiscall
LiteScript::Character::operator=(String *__return_storage_ptr__,Character *this,String *str)

{
  String *str_local;
  Character *this_local;
  
  String::Replace(this->str,this->i,str);
  String::String(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator=(const LiteScript::String& str) {
    this->str.Replace(this->i, str);
    return str;
}